

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireHandWithTwoCardsTest_tryAddCardOnTableauPileWithFail_Test::TestBody
          (SolitaireHandWithTwoCardsTest_tryAddCardOnTableauPileWithFail_Test *this)

{
  TableauPileMock *this_00;
  bool bVar1;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_01;
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  *this_02;
  char *message;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  undefined1 *this_03;
  AssertHelper local_d8;
  Message local_d0;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_c8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_b0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&> local_80;
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  local_68;
  WithoutMatchers local_45 [13];
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  local_38;
  undefined1 local_28 [8];
  Cards cardsToAdd;
  SolitaireHandWithTwoCardsTest_tryAddCardOnTableauPileWithFail_Test *this_local;
  
  this_03 = (anonymous_namespace)::twoCards;
  cardsToAdd.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  local_38.function_mocker_ =
       (FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
        *)piles::TableauPileMock::gmock_createSnapshot
                    ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                      *)(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
                        super_SolitaireTest.lastTableauPileMock,(TableauPileMock *)this_03);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::operator()(&local_38,local_45,(void *)0x0);
  testing::internal::
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x211,"lastTableauPileMock","createSnapshot()");
  this_00 = (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
            super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  Matcher(&local_80,
          (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28);
  piles::TableauPileMock::gmock_tryAddCards(&local_68,this_00,&local_80);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
            ::operator()(&local_68,
                         (WithoutMatchers *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),(void *)0x0);
  testing::internal::
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>::
  InternalExpectedAt(this_02,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                     ,0x212,"lastTableauPileMock","tryAddCards(cardsToAdd)");
  testing::internal::
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>::
  ~MockSpec(&local_68);
  testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~Matcher(&local_80);
  piles::PileId::PileId
            ((PileId *)&gtest_ar.message_,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  Solitaire::tryAddCardsOnTableauPile
            (&(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
              super_SolitaireTest.solitaire,(PileId *)&gtest_ar.message_);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_c8,(testing *)(anonymous_namespace)::twoCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_b0,(internal *)&local_c8,matcher);
  Solitaire::getCardsInHand
            (&(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
              super_SolitaireTest.solitaire);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_98,(char *)&local_b0,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_b0);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x215,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28);
  return;
}

Assistant:

TEST_F(SolitaireHandWithTwoCardsTest, tryAddCardOnTableauPileWithFail) {
    auto cardsToAdd {twoCards};

    EXPECT_CALL(lastTableauPileMock, createSnapshot());
    EXPECT_CALL(lastTableauPileMock, tryAddCards(cardsToAdd));

    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(twoCards));
}